

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_apply_r(lyd_node **first_node,lyd_node *parent_node,lyd_node *diff_node,
                       lyd_diff_cb diff_cb,void *cb_data,ly_ht **dup_inst)

{
  uint16_t uVar1;
  ly_ctx *plVar2;
  lysc_node *plVar3;
  lyd_diff_cb diff_cb_00;
  void *cb_data_00;
  LY_ERR LVar4;
  lys_module *plVar5;
  char *__ptr;
  lyd_meta *meta;
  lyd_node *plVar6;
  lyd_node **first_node_00;
  uint uVar7;
  char *format;
  lyd_node_any *any;
  lysc_node **pplVar8;
  char *pcVar9;
  char *pcVar10;
  lyd_node *match;
  ly_ctx *local_60;
  lyd_diff_cb local_58;
  lyd_diff_op op;
  lyd_node *local_48;
  ly_ht *child_dup_inst;
  void *local_38;
  
  child_dup_inst = (ly_ht *)0x0;
  if (diff_node->schema == (lysc_node *)0x0) {
    plVar5 = (lys_module *)&diff_node[2].schema;
  }
  else {
    plVar5 = diff_node->schema->module;
  }
  plVar2 = plVar5->ctx;
  local_58 = diff_cb;
  local_48 = parent_node;
  LVar4 = lyd_diff_get_op(diff_node,&op);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  plVar3 = diff_node->schema;
  local_60 = plVar2;
  local_38 = cb_data;
  if (((plVar3 == (lysc_node *)0x0) || ((plVar3->nodetype & 0x18) == 0)) ||
     ((plVar3->flags & 0x40) == 0)) {
code_r0x00116adf:
    switch(op) {
    case LYD_DIFF_OP_CREATE:
      LVar4 = lyd_dup_single(diff_node,(lyd_node_inner *)0x0,2,&match);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (local_48 == (lyd_node *)0x0) {
        LVar4 = lyd_insert_sibling(*first_node,match,first_node);
      }
      else if ((match->flags & 8) == 0) {
        LVar4 = lyd_insert_child(local_48,match);
      }
      else {
        LVar4 = lyplg_ext_insert(local_48,match);
      }
      if (LVar4 == LY_SUCCESS) goto LAB_00116ef6;
      goto LAB_00116dca;
    case LYD_DIFF_OP_DELETE:
      LVar4 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&match);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (match != (lyd_node *)0x0) {
        if ((match == *first_node) && (match->parent == (lyd_node_inner *)0x0)) {
          if (local_48 != (lyd_node *)0x0) {
            __assert_fail("!parent_node",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                          ,0x539,
                          "LY_ERR lyd_diff_apply_r(struct lyd_node **, struct lyd_node *, const struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **)"
                         );
          }
          *first_node = (*first_node)->next;
        }
        lyd_free_tree(match);
        return LY_SUCCESS;
      }
      break;
    case LYD_DIFF_OP_REPLACE:
      if ((plVar3->nodetype & 100) == 0) {
        pcVar10 = lys_nodetype2str(plVar3->nodetype);
        pplVar8 = &diff_node[1].schema;
        if (diff_node->schema != (lysc_node *)0x0) {
          pplVar8 = (lysc_node **)&diff_node->schema->name;
        }
        ly_log(local_60,LY_LLERR,LY_EINVAL,"Operation \"replace\" is invalid for %s node \"%s\".",
               pcVar10,*pplVar8);
        return LY_EINVAL;
      }
      LVar4 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&match);
      plVar6 = match;
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (match != (lyd_node *)0x0) {
        if (diff_node->schema->nodetype != 4) {
          LVar4 = lyd_any_copy_value(match,(lyd_any_value *)(diff_node + 1),
                                     *(LYD_ANYDATA_VALUETYPE *)&diff_node[1].schema);
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
LAB_00116ebd:
          match->flags = diff_node->flags;
          goto LAB_00116ef6;
        }
        pcVar10 = lyd_get_value(diff_node);
        LVar4 = lyd_change_term(plVar6,pcVar10);
        if ((LVar4 & ~LY_EEXIST) == LY_SUCCESS) goto LAB_00116ebd;
        __ptr = lyd_path(match,LYD_PATH_STD,(char *)0x0,0);
        format = "Unexpected value of node \"%s\" in %s.";
        pcVar9 = "data";
        pcVar10 = __ptr;
        goto LAB_00116e8d;
      }
      break;
    case LYD_DIFF_OP_NONE:
      LVar4 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&match);
      plVar2 = local_60;
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (match != (lyd_node *)0x0) {
        if ((match->schema->nodetype & 0xc) == 0) {
          plVar6 = lyd_child_no_keys(diff_node);
          if (plVar6 == (lyd_node *)0x0) {
            pplVar8 = &diff_node[1].schema;
            if (diff_node->schema != (lysc_node *)0x0) {
              pplVar8 = (lysc_node **)&diff_node->schema->name;
            }
            ly_log(plVar2,LY_LLERR,LY_EINVAL,
                   "Operation \"none\" is invalid for node \"%s\" without children.",*pplVar8);
            return LY_EINVAL;
          }
        }
        else {
          if ((diff_node->flags & 1) == 0) {
            uVar7 = match->flags & 0xfffffffe;
          }
          else {
            uVar7 = match->flags | 1;
          }
          match->flags = uVar7;
        }
        goto LAB_00116ef6;
      }
      break;
    default:
      ly_log(plVar2,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x55a);
      return LY_EINT;
    }
LAB_00116cdf:
    __ptr = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
    ly_log(local_60,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",__ptr);
  }
  else {
    if (op != LYD_DIFF_OP_CREATE) {
      if (op != LYD_DIFF_OP_REPLACE) goto code_r0x00116adf;
      LVar4 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&match);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (match != (lyd_node *)0x0) goto LAB_00116d6a;
      goto LAB_00116cdf;
    }
    LVar4 = lyd_dup_single(diff_node,(lyd_node_inner *)0x0,2,&match);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
LAB_00116d6a:
    plVar3 = diff_node->schema;
    uVar1 = plVar3->nodetype;
    if (uVar1 == 8) {
      if ((plVar3->flags & 1) == 0) goto LAB_00116e2b;
LAB_00116d89:
      pcVar10 = "yang:value";
      if (uVar1 == 0x10) {
        pcVar10 = "yang:key";
      }
    }
    else {
      if ((uVar1 != 0x10) || ((plVar3->flags & 0x200) == 0)) goto LAB_00116d89;
LAB_00116e2b:
      pcVar10 = "yang:position";
    }
    meta = lyd_find_meta(diff_node->meta,(lys_module *)0x0,pcVar10);
    if (meta != (lyd_meta *)0x0) {
      pcVar10 = lyd_get_meta_value(meta);
      if (*pcVar10 == '\0') {
        pcVar10 = (char *)0x0;
      }
      LVar4 = lyd_diff_insert(first_node,local_48,match,pcVar10);
      if (LVar4 != LY_SUCCESS) {
        if (op != LYD_DIFF_OP_CREATE) {
          return LVar4;
        }
LAB_00116dca:
        lyd_free_tree(match);
        return LVar4;
      }
LAB_00116ef6:
      cb_data_00 = local_38;
      diff_cb_00 = local_58;
      if ((local_58 != (lyd_diff_cb)0x0) &&
         (LVar4 = (*local_58)(diff_node,match,local_38), LVar4 != LY_SUCCESS)) {
        return LVar4;
      }
      plVar6 = lyd_child_no_keys(diff_node);
      for (; plVar6 != (lyd_node *)0x0; plVar6 = plVar6->next) {
        first_node_00 = lyd_node_child_p(match);
        LVar4 = lyd_diff_apply_r(first_node_00,match,plVar6,diff_cb_00,cb_data_00,&child_dup_inst);
        if (LVar4 != LY_SUCCESS) goto LAB_00116f5b;
      }
      LVar4 = LY_SUCCESS;
LAB_00116f5b:
      lyd_dup_inst_free(child_dup_inst);
      return LVar4;
    }
    __ptr = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
    format = "Failed to find metadata \"%s\" for node \"%s\".";
    pcVar9 = __ptr;
LAB_00116e8d:
    ly_log(local_60,LY_LLERR,LY_EINVAL,format,pcVar10,pcVar9);
  }
  free(__ptr);
  return LY_EINVAL;
}

Assistant:

static LY_ERR
lyd_diff_apply_r(struct lyd_node **first_node, struct lyd_node *parent_node, const struct lyd_node *diff_node,
        lyd_diff_cb diff_cb, void *cb_data, struct ly_ht **dup_inst)
{
    LY_ERR ret;
    struct lyd_node *match, *diff_child;
    const char *str_val, *meta_str;
    enum lyd_diff_op op;
    struct lyd_meta *meta;
    struct ly_ht *child_dup_inst = NULL;
    const struct ly_ctx *ctx = LYD_CTX(diff_node);

    /* read all the valid attributes */
    LY_CHECK_RET(lyd_diff_get_op(diff_node, &op));

    /* handle specific user-ordered (leaf-)lists operations separately */
    if (lysc_is_userordered(diff_node->schema) && ((op == LYD_DIFF_OP_CREATE) || (op == LYD_DIFF_OP_REPLACE))) {
        if (op == LYD_DIFF_OP_REPLACE) {
            /* find the node (we must have some siblings because the node was only moved) */
            LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
            LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);
        } else {
            /* duplicate the node */
            LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));
        }

        /* get "key", "value", or "position" metadata string value */
        if (lysc_is_dup_inst_list(diff_node->schema)) {
            meta_str = "yang:position";
        } else if (diff_node->schema->nodetype == LYS_LIST) {
            meta_str = "yang:key";
        } else {
            meta_str = "yang:value";
        }
        meta = lyd_find_meta(diff_node->meta, NULL, meta_str);
        LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_str, diff_node), LY_EINVAL);
        str_val = lyd_get_meta_value(meta);

        /* insert/move the node */
        if (str_val[0]) {
            ret = lyd_diff_insert(first_node, parent_node, match, str_val);
        } else {
            ret = lyd_diff_insert(first_node, parent_node, match, NULL);
        }
        if (ret) {
            if (op == LYD_DIFF_OP_CREATE) {
                lyd_free_tree(match);
            }
            return ret;
        }

        goto next_iter_r;
    }

    /* apply operation */
    switch (op) {
    case LYD_DIFF_OP_NONE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        if (match->schema->nodetype & LYD_NODE_TERM) {
            /* special case of only dflt flag change */
            if (diff_node->flags & LYD_DEFAULT) {
                match->flags |= LYD_DEFAULT;
            } else {
                match->flags &= ~LYD_DEFAULT;
            }
        } else {
            /* none operation on nodes without children is redundant and hence forbidden */
            if (!lyd_child_no_keys(diff_node)) {
                LOGERR(ctx, LY_EINVAL, "Operation \"none\" is invalid for node \"%s\" without children.",
                        LYD_NAME(diff_node));
                return LY_EINVAL;
            }
        }
        break;
    case LYD_DIFF_OP_CREATE:
        /* duplicate the node */
        LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));

        /* insert it at the end */
        ret = 0;
        if (parent_node) {
            if (match->flags & LYD_EXT) {
                ret = lyplg_ext_insert(parent_node, match);
            } else {
                ret = lyd_insert_child(parent_node, match);
            }
        } else {
            ret = lyd_insert_sibling(*first_node, match, first_node);
        }
        if (ret) {
            lyd_free_tree(match);
            return ret;
        }

        break;
    case LYD_DIFF_OP_DELETE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* remove it */
        if ((match == *first_node) && !match->parent) {
            assert(!parent_node);
            /* we have removed the top-level node */
            *first_node = (*first_node)->next;
        }
        lyd_free_tree(match);

        /* we are not going recursively in this case, the whole subtree was already deleted */
        return LY_SUCCESS;
    case LYD_DIFF_OP_REPLACE:
        if (!(diff_node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA))) {
            LOGERR(ctx, LY_EINVAL, "Operation \"replace\" is invalid for %s node \"%s\".",
                    lys_nodetype2str(diff_node->schema->nodetype), LYD_NAME(diff_node));
            return LY_EINVAL;
        }

        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* update the value */
        if (diff_node->schema->nodetype == LYS_LEAF) {
            ret = lyd_change_term(match, lyd_get_value(diff_node));
            LY_CHECK_ERR_RET(ret && (ret != LY_EEXIST), LOGERR_UNEXPVAL(ctx, match, "data"), LY_EINVAL);
        } else {
            struct lyd_node_any *any = (struct lyd_node_any *)diff_node;

            LY_CHECK_RET(lyd_any_copy_value(match, &any->value, any->value_type));
        }

        /* with flags */
        match->flags = diff_node->flags;
        break;
    default:
        LOGINT_RET(ctx);
    }

next_iter_r:
    if (diff_cb) {
        /* call callback */
        LY_CHECK_RET(diff_cb(diff_node, match, cb_data));
    }

    /* apply diff recursively */
    ret = LY_SUCCESS;
    LY_LIST_FOR(lyd_child_no_keys(diff_node), diff_child) {
        ret = lyd_diff_apply_r(lyd_node_child_p(match), match, diff_child, diff_cb, cb_data, &child_dup_inst);
        if (ret) {
            break;
        }
    }

    lyd_dup_inst_free(child_dup_inst);
    return ret;
}